

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derDecDeep(octet *der,size_t count,size_t deep)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  size_t sVar4;
  uint uVar5;
  size_t len;
  u32 tag;
  size_t local_30;
  uint local_24;
  
  if (((deep < 0x21) &&
      (uVar3 = derTLDec(&local_24,&local_30,der,count), uVar3 != 0xffffffffffffffff)) &&
     (uVar1 = local_30 + uVar3, uVar2 = local_24, uVar1 <= count)) {
    do {
      uVar5 = uVar2;
      uVar2 = uVar5 >> 8;
    } while (0xff < uVar5);
    if ((uVar5 & 0x20) == 0) {
      uVar3 = uVar1;
      if ((int)local_24 < 6) {
        if (local_24 == 3) {
          uVar3 = derTBITDec((octet *)0x0,&local_30,der,count,3);
        }
        else if (local_24 == 5) {
          uVar3 = derDec4(der,count,5,(void *)0x0,0);
        }
      }
      else if (local_24 == 6) {
        uVar3 = derOIDDec((char *)0x0,&local_30,der,count);
      }
      else if (local_24 == 0x13) {
        uVar3 = derTPSTRDec((char *)0x0,&local_30,der,count,0x13);
      }
    }
    else if (local_30 != 0) {
      do {
        sVar4 = derDecDeep(der + uVar3,local_30,deep + 1);
        if (sVar4 == 0xffffffffffffffff) goto LAB_0010d85a;
        uVar3 = uVar3 + sVar4;
        local_30 = local_30 - sVar4;
      } while (local_30 != 0);
    }
  }
  else {
LAB_0010d85a:
    uVar3 = 0xffffffffffffffff;
  }
  return uVar3;
}

Assistant:

static size_t derDecDeep(const octet der[], size_t count, size_t deep)
{
	u32 tag;
	size_t len;
	size_t c;
	// превышена глубина вложенности?
	if (deep > 32)
		return SIZE_MAX;
	// обработать TL
	c = derTLDec(&tag, &len, der, count);
	if (c == SIZE_MAX || c + len > count)
		return SIZE_MAX;
	// примитивный код?
	if (derTIsPrimitive(tag))
	{
		if (tag == 0x03)
			return derBITDec(0, &len, der, count);
		if (tag == 0x05)
			return derNULLDec(der, count);
		if (tag == 0x06)
			return derOIDDec(0, &len, der, count);
		if (tag == 0x13)
			return derPSTRDec(0, &len, der, count);
		return c + len;
	}
	// конструктивный код
	while (len)
	{
		size_t c1;
		c1 = derDecDeep(der + c, len, deep + 1);
		if (c1 == SIZE_MAX)
			return SIZE_MAX;
		c += c1, len -= c1;
	}
	return c;
}